

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

int fdb_validate_files(size_t num_filenames,char **filenames)

{
  fdb_file_handle *fhandle_00;
  bool bVar1;
  int iVar2;
  fdb_status fVar3;
  long lVar4;
  _Base_ptr p_Var5;
  int iVar6;
  size_t sVar7;
  fdb_file_handle *fhandle;
  string suffix;
  string str;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sorted_filenames;
  undefined1 local_220 [248];
  fdb_config config;
  
  if (filenames == (char **)0x0 || num_filenames == 0) {
    iVar2 = -1;
  }
  else {
    sorted_filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &sorted_filenames._M_t._M_impl.super__Rb_tree_header._M_header;
    sorted_filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    sorted_filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    sorted_filenames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sorted_filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         sorted_filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (sVar7 = 0; num_filenames != sVar7; sVar7 = sVar7 + 1) {
      std::__cxx11::string::string((string *)&str,filenames[sVar7],(allocator *)local_220);
      lVar4 = std::__cxx11::string::rfind((char *)&str,0x14f2b8);
      if (lVar4 == -1) {
LAB_00137609:
        std::__cxx11::string::~string((string *)&str);
        iVar2 = -1;
        goto LAB_0013762c;
      }
      std::__cxx11::string::substr((ulong)&suffix,(ulong)&str);
      iVar2 = atoi(suffix._M_dataplus._M_p);
      if (iVar2 == 0) {
        bVar1 = std::operator!=(&suffix,"0");
        if (bVar1) {
          std::__cxx11::string::~string((string *)&suffix);
          goto LAB_00137609;
        }
      }
      local_220._0_4_ = iVar2;
      std::__cxx11::string::string((string *)(local_220 + 8),(string *)&str);
      std::
      _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<int,std::__cxx11::string>>
                ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  *)&sorted_filenames,
                 (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_220);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      std::__cxx11::string::~string((string *)&suffix);
      std::__cxx11::string::~string((string *)&str);
    }
    get_default_config();
    memcpy(&config,local_220,0xf8);
    iVar6 = 0;
    for (p_Var5 = sorted_filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &sorted_filenames._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      fVar3 = fdb_open(&fhandle,(char *)p_Var5[1]._M_parent,&config);
      fhandle_00 = fhandle;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        iVar6 = iVar6 + -1;
        break;
      }
      bVar1 = filemgr_is_successfully_compacted(fhandle->root->file);
      if (!bVar1) {
        iVar2 = strcmp(fhandle_00->root->file->filename,(char *)p_Var5[1]._M_parent);
        if (iVar2 == 0) {
          fdb_close(fhandle_00);
          break;
        }
      }
      fdb_close(fhandle_00);
      iVar6 = iVar6 + 1;
    }
    iVar2 = (int)num_filenames + -1;
    if (iVar6 < (int)num_filenames) {
      iVar2 = iVar6;
    }
LAB_0013762c:
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&sorted_filenames._M_t);
  }
  return iVar2;
}

Assistant:

LIBFDB_API
int fdb_validate_files(const size_t num_filenames,
                       const char** filenames) {
    fdb_status s;
    fdb_file_handle* fhandle;
    fdb_config config;

    if (!num_filenames || !filenames) {
        // Invalid arguments
        return -1;
    }

    // File name should be XXX.0, XXX.1, XXX.2, ...
    // Otherwise, it will result in undefined behavior.
    std::map<int, std::string> sorted_filenames;
    for (size_t i=0; i<num_filenames; ++i) {
        std::string str(filenames[i]);
        size_t last_dot_pos = str.rfind(".");
        if (last_dot_pos == std::string::npos) {
            // Invalid filename.
            return -1;
        }
        std::string suffix = str.substr(last_dot_pos+1);
        int compaction_no = atoi(suffix.c_str());
        if (compaction_no == 0 && suffix != "0") {
            // This means that suffix doesn't contain compaction number.
            return -1;
        }
        sorted_filenames.insert( std::make_pair(compaction_no, str) );
    }

    config = fdb_get_default_config();
    // Note: READ_ONLY flag prevents compaction recovery,
    //       so we open FDB file without it.

    int valid_file_number = 0;
    for (auto& entry: sorted_filenames) {
        s = fdb_open(&fhandle, entry.second.c_str(), &config);
        if (s != FDB_RESULT_SUCCESS) {
            // Broken file, previous file is the last valid one.
            valid_file_number--;
            break;
        }
        if (filemgr_is_successfully_compacted(fhandle->root->file) ||
            strcmp(fhandle->root->file->filename, entry.second.c_str())) {
            // 1) 'successfully_compacted' flag support version:
            //    -> just check flag
            // 2) Otherwise: if opened file name is different
            //    to original -> this implies that compaction succeeded.
            valid_file_number++;
            s = fdb_close(fhandle);
        } else {
            s = fdb_close(fhandle);
            break;
        }
    }

    if (valid_file_number >= (int)num_filenames) {
        // All files are valid.
        // Return the last index number.
        valid_file_number = num_filenames - 1;
    }

    return valid_file_number;
}